

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O2

void __thiscall
wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::
Call*>>&,wasm::Module*)::ReturnUpdater::visitReturn(wasm::Return__(void *this,Return *curr)

{
  Expression *value;
  Drop *left;
  Block *expression;
  Builder local_28;
  Builder builder;
  
  value = curr->value;
  if (value != (Expression *)0x0) {
    curr->value = (Expression *)0x0;
    local_28.wasm = *(Module **)((long)this + 0xd8);
    left = Builder::makeDrop(&local_28,value);
    expression = Builder::makeSequence(&local_28,(Expression *)left,(Expression *)curr);
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::replaceCurrent
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)this,
               (Expression *)expression);
    return;
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DeadArgumentElimination.cpp"
                ,0x149,
                "void wasm::DAE::removeReturnValue(Function *, std::vector<Call *> &, Module *)::ReturnUpdater::visitReturn(Return *)"
               );
}

Assistant:

void visitReturn(Return* curr) {
        auto* value = curr->value;
        assert(value);
        curr->value = nullptr;
        Builder builder(*module);
        replaceCurrent(builder.makeSequence(builder.makeDrop(value), curr));
      }